

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.hpp
# Opt level: O0

ssize_t __thiscall
zmq::detail::socket_base::recv(socket_base *this,int __fd,void *__buf,size_t __n,int __flags)

{
  undefined8 uVar1;
  int iVar2;
  void *pvVar3;
  size_t sVar4;
  unsigned_long *puVar5;
  error_t *this_00;
  undefined4 in_register_00000034;
  size_t local_48;
  unsigned_long local_40;
  recv_buffer_size local_38;
  int local_28;
  int local_24;
  int nbytes;
  recv_flags flags_local;
  socket_base *this_local;
  mutable_buffer buf_local;
  
  _nbytes = (undefined8 *)CONCAT44(in_register_00000034,__fd);
  uVar1 = *_nbytes;
  local_24 = __flags;
  this_local = (socket_base *)__buf;
  buf_local._data = (void *)__n;
  pvVar3 = mutable_buffer::data((mutable_buffer *)&this_local);
  sVar4 = mutable_buffer::size((mutable_buffer *)&this_local);
  local_28 = zmq_recv(uVar1,pvVar3,sVar4,local_24);
  if (local_28 < 0) {
    iVar2 = zmq_errno();
    if (iVar2 != 0xb) {
      this_00 = (error_t *)__cxa_allocate_exception(0x10);
      error_t::error_t(this_00);
      __cxa_throw(this_00,&error_t::typeinfo,error_t::~error_t);
    }
    std::optional<zmq::recv_buffer_size>::optional((optional<zmq::recv_buffer_size> *)this);
  }
  else {
    local_40 = (unsigned_long)local_28;
    local_48 = mutable_buffer::size((mutable_buffer *)&this_local);
    puVar5 = std::min<unsigned_long>(&local_40,&local_48);
    local_38.size = *puVar5;
    local_38.untruncated_size = (size_t)local_28;
    std::optional<zmq::recv_buffer_size>::optional<zmq::recv_buffer_size,_true>
              ((optional<zmq::recv_buffer_size> *)this,&local_38);
  }
  return (ssize_t)this;
}

Assistant:

ZMQ_NODISCARD
    recv_buffer_result_t recv(mutable_buffer buf,
                              recv_flags flags = recv_flags::none)
    {
        const int nbytes =
          zmq_recv(_handle, buf.data(), buf.size(), static_cast<int>(flags));
        if (nbytes >= 0) {
            return recv_buffer_size{
              (std::min)(static_cast<size_t>(nbytes), buf.size()),
              static_cast<size_t>(nbytes)};
        }
        if (zmq_errno() == EAGAIN)
            return {};
        throw error_t();
    }